

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::
FeatureResolverPoolTest_CompileDefaultsInvalidValueRemovedAfterFeature_Test::
~FeatureResolverPoolTest_CompileDefaultsInvalidValueRemovedAfterFeature_Test
          (FeatureResolverPoolTest_CompileDefaultsInvalidValueRemovedAfterFeature_Test *this)

{
  (this->super_FeatureResolverPoolTest).super_Test._vptr_Test =
       (_func_int **)&PTR__FeatureResolverPoolTest_018f3240;
  FeatureSetDefaults::~FeatureSetDefaults(&(this->super_FeatureResolverPoolTest).defaults_);
  FileDescriptorProto::~FileDescriptorProto(&(this->super_FeatureResolverPoolTest).file_proto_);
  DescriptorPool::~DescriptorPool(&(this->super_FeatureResolverPoolTest).pool_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x1c0);
  return;
}

Assistant:

TEST_F(FeatureResolverPoolTest,
       CompileDefaultsInvalidValueRemovedAfterFeature) {
  const FileDescriptor* file = ParseSchema(R"schema(
    syntax = "proto2";
    package test;
    import "google/protobuf/descriptor.proto";

    extend google.protobuf.FeatureSet {
      optional Foo bar = 9999;
    }
    enum FooValues {
      UNKNOWN = 0;
      VALUE = 1 [feature_support = {
        edition_removed: EDITION_99997_TEST_ONLY
      }];
    }
    message Foo {
      optional FooValues bool_field = 1 [
        targets = TARGET_TYPE_FIELD,
        feature_support.edition_introduced = EDITION_2023,
        feature_support.edition_removed = EDITION_2024,
        edition_defaults = { edition: EDITION_LEGACY, value: "UNKNOWN" }
      ];
    }
  )schema");
  ASSERT_NE(file, nullptr);

  const FieldDescriptor* ext = file->extension(0);
  EXPECT_THAT(
      FeatureResolver::CompileDefaults(feature_set_, {ext}, EDITION_2023,
                                       EDITION_2023),
      HasError(AllOf(HasSubstr("test.VALUE"), HasSubstr("removed after"),
                     HasSubstr("test.Foo.bool_field"))));
}